

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

void Fxch_ManSCHashTablesInit(Fxch_Man_t *pFxchMan)

{
  uint uVar1;
  Vec_Wec_t *p;
  Vec_Int_t *pVVar2;
  Fxch_SCHashTable_t *pFVar3;
  uint uVar4;
  int i;
  int nEntries;
  
  p = pFxchMan->vCubes;
  nEntries = 0;
  for (i = 0; i < p->nSize; i = i + 1) {
    pVVar2 = Vec_WecEntry(p,i);
    uVar1 = pVVar2->nSize;
    uVar4 = (uVar1 - 1) * uVar1 >> 1;
    if ((int)uVar1 < 4) {
      uVar4 = uVar1;
    }
    nEntries = nEntries + uVar4 + 1;
  }
  pFVar3 = Fxch_SCHashTableCreate(pFxchMan,nEntries);
  pFxchMan->pSCHashTable = pFVar3;
  return;
}

Assistant:

void Fxch_ManSCHashTablesInit( Fxch_Man_t* pFxchMan )
{
    Vec_Wec_t* vCubes = pFxchMan->vCubes;
    Vec_Int_t* vCube;
    int iCube,
        nTotalHashed = 0;

    Vec_WecForEachLevel( vCubes, vCube, iCube )
    {
        int nLits = Vec_IntSize( vCube ) - 1,
            nSubCubes = nLits <= 2? nLits + 1: ( nLits * nLits + nLits ) / 2;

        nTotalHashed += nSubCubes + 1;
    }

    pFxchMan->pSCHashTable = Fxch_SCHashTableCreate( pFxchMan, nTotalHashed );
}